

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

double regularizer_direction_magnitude<dense_parameters>
                 (vw *param_1,bfgs *b,double regularizer,dense_parameters *weights)

{
  float fVar1;
  long lVar2;
  double dVar3;
  bool bVar4;
  uint32_t uVar5;
  float *pfVar6;
  char *pcVar7;
  int __c;
  dense_parameters *in_RDX;
  long in_RSI;
  dense_iterator<float> *rhs;
  double in_XMM0_Qa;
  iterator iter_1;
  iterator iter;
  double ret;
  dense_parameters *in_stack_ffffffffffffff60;
  dense_iterator<float> local_88;
  dense_iterator<float> local_70;
  dense_iterator<float> local_58;
  dense_iterator<float> local_40;
  double local_28;
  dense_parameters *local_20;
  double local_18;
  long local_10;
  
  local_28 = 0.0;
  if (*(long *)(in_RSI + 0xd8) == 0) {
    local_18 = in_XMM0_Qa;
    dense_parameters::begin(in_stack_ffffffffffffff60);
    while( true ) {
      dense_parameters::end(in_stack_ffffffffffffff60);
      bVar4 = dense_iterator<float>::operator!=(&local_40,&local_58);
      dVar3 = local_18;
      if (!bVar4) break;
      pfVar6 = dense_iterator<float>::operator*(&local_40);
      fVar1 = pfVar6[2];
      pfVar6 = dense_iterator<float>::operator*(&local_40);
      local_28 = dVar3 * (double)fVar1 * (double)pfVar6[2] + local_28;
      dense_iterator<float>::operator++(&local_40);
    }
  }
  else {
    local_20 = in_RDX;
    local_10 = in_RSI;
    dense_parameters::begin(in_stack_ffffffffffffff60);
    while( true ) {
      dense_parameters::end(in_stack_ffffffffffffff60);
      rhs = &local_88;
      bVar4 = dense_iterator<float>::operator!=(&local_70,rhs);
      if (!bVar4) break;
      lVar2 = *(long *)(local_10 + 0xd8);
      pcVar7 = dense_iterator<float>::index(&local_70,(char *)rhs,__c);
      uVar5 = dense_parameters::stride_shift(local_20);
      fVar1 = *(float *)(lVar2 + ((ulong)pcVar7 >> ((byte)uVar5 & 0x3f)) * 8);
      pfVar6 = dense_iterator<float>::operator*(&local_70);
      in_stack_ffffffffffffff60 = (dense_parameters *)((double)fVar1 * (double)pfVar6[2]);
      pfVar6 = dense_iterator<float>::operator*(&local_70);
      local_28 = (double)in_stack_ffffffffffffff60 * (double)pfVar6[2] + local_28;
      dense_iterator<float>::operator++(&local_70);
    }
  }
  return local_28;
}

Assistant:

double regularizer_direction_magnitude(vw& /* all */, bfgs& b, double regularizer, T& weights)
{
  double ret = 0.;
  if (b.regularizers == nullptr)
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += regularizer * (&(*iter))[W_DIR] * (&(*iter))[W_DIR];

  else
  {
    for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
      ret += ((double)b.regularizers[2 * (iter.index() >> weights.stride_shift())]) * (&(*iter))[W_DIR] *
          (&(*iter))[W_DIR];
  }
  return ret;
}